

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void Memory::DeleteArray<Memory::ArenaAllocator,IR::Opnd*>
               (AllocatorType *allocator,size_t count,Opnd **obj)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  long *plVar4;
  long extraout_RDX;
  code *local_48;
  FreeFuncType freeFunc;
  Opnd **obj_local;
  size_t count_local;
  AllocatorType *allocator_local;
  
  if (count != 0) {
    if ((count != 0) && (DestructArray<IR::Opnd*>(count,obj), (count << 3) / count != 8)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x195,"(count * sizeof(T) / count == sizeof(T))",
                         "count * sizeof(T) / count == sizeof(T)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    local_48 = (code *)TypeAllocatorFunc<Memory::ArenaAllocator,_IR::Opnd_*>::GetFreeFunc();
    plVar4 = (long *)((long)&(allocator->
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             ).super_Allocator.outOfMemoryFunc + extraout_RDX);
    if (((ulong)local_48 & 1) != 0) {
      local_48 = *(code **)(local_48 + *plVar4 + -1);
    }
    (*local_48)(plVar4,obj,count << 3);
  }
  return;
}

Assistant:

void DeleteArray(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, size_t count, T * obj)
{
    if (count == 0 && AllocatorInfo<TAllocator, T>::AllocatorType::FakeZeroLengthArray)
    {
        return;
    }

    if (count != 0)
    {
        DestructArray(count, obj);

        // DeleteArray can only be called when an array is allocated successfully.
        // So the add should never overflow
        Assert(count * sizeof(T) / count == sizeof(T));
    }

    auto freeFunc = AllocatorInfo<TAllocator, T>::AllocatorFunc::GetFreeFunc();
    (allocator->*freeFunc)((void *)obj, sizeof(T) * count);
}